

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::InitBlockScopedNonTemps
          (ByteCodeGenerator *this,ParseNode *pnode,FuncInfo *funcInfo)

{
  ParseNodeVar *pPVar1;
  Symbol *this_00;
  code *pcVar2;
  anon_class_16_2_85211fcd fn;
  bool bVar3;
  RegSlot RVar4;
  ParseNodeFnc *this_01;
  Scope *pSVar5;
  FuncInfo *pFVar6;
  ParseNodeBlock *pnodeBlock_00;
  ParseNodeCatch *pPVar7;
  ParseNodeWith *pPVar8;
  undefined4 *puVar9;
  RegSlot withLoc;
  anon_class_16_2_85211fcd fnInit;
  RegSlot scopeLoc;
  Scope *scope;
  ParseNodeBlock *pnodeBlock;
  Symbol *sym;
  ParseNodeVar *pnodeName;
  ParseNodeFnc *pnodeFnc;
  FuncInfo *funcInfo_local;
  ParseNode *pnode_local;
  ByteCodeGenerator *this_local;
  
  funcInfo_local = (FuncInfo *)pnode;
  do {
    if (funcInfo_local == (FuncInfo *)0x0) {
      return;
    }
    switch((char)funcInfo_local->inlineCacheCount) {
    case 'U':
      this_01 = ParseNode::AsParseNodeFnc((ParseNode *)funcInfo_local);
      pPVar1 = this_01->pnodeName;
      bVar3 = ParseNodeFnc::IsMethod(this_01);
      if ((!bVar3) && (pPVar1 != (ParseNodeVar *)0x0)) {
        this_00 = pPVar1->sym;
        if (this_00 == (Symbol *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x5e4,"(sym)","sym");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
        RVar4 = Symbol::GetLocation(this_00);
        if (RVar4 != 0xffffffff) {
          pSVar5 = Symbol::GetScope(this_00);
          bVar3 = Scope::IsBlockScope(pSVar5,funcInfo);
          if (bVar3) {
            pSVar5 = Symbol::GetScope(this_00);
            pFVar6 = Scope::GetFunc(pSVar5);
            if (pFVar6 == funcInfo) {
              RVar4 = Symbol::GetLocation(this_00);
              Js::ByteCodeWriter::Reg1(&this->m_writer,LdUndef,RVar4);
            }
          }
        }
      }
      funcInfo_local = (FuncInfo *)this_01->pnodeNext;
      break;
    default:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x61f,"(false)","false");
      if (bVar3) {
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
        return;
      }
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    case 'b':
      pnodeBlock_00 = ParseNode::AsParseNodeBlock((ParseNode *)funcInfo_local);
      pSVar5 = pnodeBlock_00->scope;
      if (pSVar5 != (Scope *)0x0) {
        bVar3 = Scope::IsBlockScope(pSVar5,funcInfo);
        if (((bVar3) && (RVar4 = Scope::GetLocation(pSVar5), RVar4 != 0xffffffff)) &&
           (bVar3 = FuncInfo::IsTmpReg(funcInfo,RVar4), !bVar3)) {
          Js::ByteCodeWriter::Reg1(&this->m_writer,LdUndef,RVar4);
        }
        fn.funcInfo = funcInfo;
        fn.this = this;
        IterateBlockScopedVariables<ByteCodeGenerator::InitBlockScopedNonTemps(ParseNode*,FuncInfo*)::__0>
                  (this,pnodeBlock_00,fn);
      }
      InitBlockScopedNonTemps(this,pnodeBlock_00->pnodeScopes,funcInfo);
      funcInfo_local = (FuncInfo *)pnodeBlock_00->pnodeNext;
      break;
    case 'd':
      RVar4 = funcInfo_local->rootObjectStoreInlineCacheCount;
      if ((RVar4 == 0xffffffff) || (bVar3 = FuncInfo::IsTmpReg(funcInfo,RVar4), bVar3)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x617,
                           "(withLoc != Js::Constants::NoRegister && !funcInfo->IsTmpReg(withLoc))",
                           "We should put with objects at known stack locations in debug mode");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      Js::ByteCodeWriter::Reg1(&this->m_writer,LdUndef,RVar4);
      pPVar8 = ParseNode::AsParseNodeWith((ParseNode *)funcInfo_local);
      InitBlockScopedNonTemps(this,pPVar8->pnodeScopes,funcInfo);
      pPVar8 = ParseNode::AsParseNodeWith((ParseNode *)funcInfo_local);
      funcInfo_local = (FuncInfo *)pPVar8->pnodeNext;
      break;
    case 'j':
      pPVar7 = ParseNode::AsParseNodeCatch((ParseNode *)funcInfo_local);
      InitBlockScopedNonTemps(this,pPVar7->pnodeScopes,funcInfo);
      pPVar7 = ParseNode::AsParseNodeCatch((ParseNode *)funcInfo_local);
      funcInfo_local = (FuncInfo *)pPVar7->pnodeNext;
    }
  } while( true );
}

Assistant:

void ByteCodeGenerator::InitBlockScopedNonTemps(ParseNode *pnode, FuncInfo *funcInfo)
{
    // Initialize all non-temp register variables on entry to the enclosing func - in particular,
    // those with lifetimes that begin after the start of user code and may not be initialized normally.
    // This protects us from, for instance, trying to restore garbage on bailout.
    // It was originally done in debugger mode only, but we do it always to avoid issues with boxing
    // garbage on exit from jitted loop bodies.
    while (pnode)
    {
        switch (pnode->nop)
        {
        case knopFncDecl:
        {
            // If this is a block-scoped function, initialize it.
            ParseNodeFnc * pnodeFnc = pnode->AsParseNodeFnc();
            ParseNodeVar *pnodeName = pnodeFnc->pnodeName;
            if (!pnodeFnc->IsMethod() && pnodeName != nullptr)
            {
                Symbol *sym = pnodeName->sym;
                Assert(sym);
                if (sym->GetLocation() != Js::Constants::NoRegister &&
                    sym->GetScope()->IsBlockScope(funcInfo) &&
                    sym->GetScope()->GetFunc() == funcInfo)
                {
                    this->m_writer.Reg1(Js::OpCode::LdUndef, sym->GetLocation());
                }
            }

            // No need to recurse to the nested scopes, as they belong to a nested function.
            pnode = pnodeFnc->pnodeNext;
            break;
        }

        case knopBlock:
        {
            ParseNodeBlock * pnodeBlock = pnode->AsParseNodeBlock();
            Scope *scope = pnodeBlock->scope;
            if (scope)
            {
                if (scope->IsBlockScope(funcInfo))
                {
                    Js::RegSlot scopeLoc = scope->GetLocation();
                    if (scopeLoc != Js::Constants::NoRegister && !funcInfo->IsTmpReg(scopeLoc))
                    {
                        this->m_writer.Reg1(Js::OpCode::LdUndef, scopeLoc);
                    }
                }
                auto fnInit = [this, funcInfo](ParseNode *pnode)
                {
                    Symbol *sym = pnode->AsParseNodeVar()->sym;
                    if (!sym->IsInSlot(this, funcInfo) && !sym->GetIsGlobal() && !sym->GetIsModuleImport())
                    {
                        this->m_writer.Reg1(Js::OpCode::InitUndecl, pnode->AsParseNodeVar()->sym->GetLocation());
                    }
                };
                IterateBlockScopedVariables(pnodeBlock, fnInit);
            }
            InitBlockScopedNonTemps(pnodeBlock->pnodeScopes, funcInfo);
            pnode = pnodeBlock->pnodeNext;
            break;
        }
        case knopCatch:
            InitBlockScopedNonTemps(pnode->AsParseNodeCatch()->pnodeScopes, funcInfo);
            pnode = pnode->AsParseNodeCatch()->pnodeNext;
            break;

        case knopWith:
        {
            Js::RegSlot withLoc = pnode->location;
            AssertMsg(withLoc != Js::Constants::NoRegister && !funcInfo->IsTmpReg(withLoc),
                "We should put with objects at known stack locations in debug mode");
            this->m_writer.Reg1(Js::OpCode::LdUndef, withLoc);
            InitBlockScopedNonTemps(pnode->AsParseNodeWith()->pnodeScopes, funcInfo);
            pnode = pnode->AsParseNodeWith()->pnodeNext;
            break;
        }

        default:
            Assert(false);
            return;
        }
    }
}